

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_crt_check_parent(mbedtls_x509_crt *child,mbedtls_x509_crt *parent,int top,int bottom)

{
  bool bVar1;
  int iVar2;
  int need_ca_bit;
  int bottom_local;
  int top_local;
  mbedtls_x509_crt *parent_local;
  mbedtls_x509_crt *child_local;
  
  iVar2 = x509_name_cmp(&child->issuer,&parent->subject);
  if (iVar2 == 0) {
    bVar1 = true;
    if ((top != 0) && (parent->version < 3)) {
      bVar1 = false;
    }
    if ((((top != 0) && (bottom != 0)) && ((child->raw).len == (parent->raw).len)) &&
       (iVar2 = memcmp((child->raw).p,(parent->raw).p,(child->raw).len), iVar2 == 0)) {
      bVar1 = false;
    }
    if ((bVar1) && (parent->ca_istrue == 0)) {
      child_local._4_4_ = -1;
    }
    else {
      if ((bVar1) && (iVar2 = mbedtls_x509_crt_check_key_usage(parent,4), iVar2 != 0)) {
        return -1;
      }
      child_local._4_4_ = 0;
    }
  }
  else {
    child_local._4_4_ = -1;
  }
  return child_local._4_4_;
}

Assistant:

static int x509_crt_check_parent( const mbedtls_x509_crt *child,
                                  const mbedtls_x509_crt *parent,
                                  int top, int bottom )
{
    int need_ca_bit;

    /* Parent must be the issuer */
    if( x509_name_cmp( &child->issuer, &parent->subject ) != 0 )
        return( -1 );

    /* Parent must have the basicConstraints CA bit set as a general rule */
    need_ca_bit = 1;

    /* Exception: v1/v2 certificates that are locally trusted. */
    if( top && parent->version < 3 )
        need_ca_bit = 0;

    /* Exception: self-signed end-entity certs that are locally trusted. */
    if( top && bottom &&
        child->raw.len == parent->raw.len &&
        memcmp( child->raw.p, parent->raw.p, child->raw.len ) == 0 )
    {
        need_ca_bit = 0;
    }

    if( need_ca_bit && ! parent->ca_istrue )
        return( -1 );

#if defined(MBEDTLS_X509_CHECK_KEY_USAGE)
    if( need_ca_bit &&
        mbedtls_x509_crt_check_key_usage( parent, MBEDTLS_X509_KU_KEY_CERT_SIGN ) != 0 )
    {
        return( -1 );
    }
#endif

    return( 0 );
}